

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O1

int __thiscall gdsForge::GDSwriteBitArr(gdsForge *this,int record,bitset<16UL> inBits)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  uchar OHout [4];
  byte local_1e;
  byte bStack_1d;
  undefined2 local_1c;
  undefined1 local_1a;
  undefined1 local_19;
  
  if ((char)record == '\x01') {
    local_1c = 0x600;
    local_1a = (undefined1)((uint)record >> 8);
    local_19 = 1;
    fwrite(&local_1c,1,4,(FILE *)this->gdsFile);
    bVar2 = 0;
    uVar5 = 0xf;
    do {
      bVar2 = bVar2 | (((ulong)inBits.super__Base_bitset<1UL>._M_w >> (uVar5 & 0x3f) & 1) != 0) <<
                      ((char)uVar5 - 8U & 0x1f);
      bVar1 = 8 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
    bStack_1d = 0;
    uVar5 = 8;
    do {
      bStack_1d = bStack_1d |
                  (((ulong)inBits.super__Base_bitset<1UL>._M_w >> (uVar5 & 0x3f) & 1) != 0) <<
                  ((byte)uVar5 & 0x1f);
      bVar1 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar1);
    _local_1e = CONCAT11(bStack_1d,bVar2);
    fwrite(&local_1e,1,2,(FILE *)this->gdsFile);
    iVar3 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Incorrect record: 0x",0x14);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,record);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int gdsForge::GDSwriteBitArr(int record, bitset<16> inBits)
{
  if ((record & 0xff) != 0x01) {
    cout << "Incorrect record: 0x" << hex << record << endl;
    cout << dec;
    return 1;
  }
  unsigned char OHout[4];

  OHout[0] = 0 & 0xff;
  OHout[1] = (2 + 4) & 0xff;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;
  fwrite(OHout, 1, 4, this->gdsFile);

  unsigned char dataOut[2] = {0, 0};

  for (int i = 15; i >= 8; i--) {
    dataOut[0] = dataOut[0] | (inBits[i] << (i - 8));
  }
  for (int i = 8; i > 0; i--) {
    dataOut[1] = dataOut[1] | (inBits[i] << i);
  }

  fwrite(dataOut, 1, 2, this->gdsFile);

  return 0;
}